

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

uint ParseToken(wchar_t **s,size_t count,wchar_t **token,uint *token_rc,uint token_not_found_rc)

{
  bool bVar1;
  int element_count1;
  size_t i;
  size_t sVar2;
  
  if ((*s != (wchar_t *)0x0) && (count != 0 && (uint)((**s & 0xffffffdfU) - 0x41U) < 0x1a)) {
    sVar2 = 0;
    do {
      element_count1 = ON_wString::Length(token[sVar2]);
      bVar1 = ON_wString::EqualOrdinal(token[sVar2],element_count1,*s,element_count1,true);
      if (bVar1) {
        *s = *s + element_count1;
        return token_rc[sVar2];
      }
      sVar2 = sVar2 + 1;
    } while (count != sVar2);
  }
  return 0;
}

Assistant:

static const unsigned int ParseToken(
  const wchar_t*& s,
  size_t count,
  const wchar_t*const* token,
  const unsigned int* token_rc,
  unsigned int token_not_found_rc
  )
{
  if (IsAtoZ(s))
  {
    for (size_t i = 0; i < count; i++)
    {
      const int len = (int)ON_wString::Length(token[i]);
      if (ON_wString::EqualOrdinal(token[i], len, s, len, true))
      {
        s += len;
        return token_rc[i];
      }
    }
  }
  return token_not_found_rc;
}